

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O0

size_t prt_state(wchar_t row,wchar_t col)

{
  _Bool _Var1;
  int16_t iVar2;
  int iVar3;
  wchar_t wVar4;
  size_t sVar5;
  wchar_t nrepeats;
  wchar_t n;
  wchar_t i;
  char text [16];
  uint8_t attr;
  wchar_t col_local;
  wchar_t row_local;
  
  text[0xf] = '\x01';
  memset(&n,0,0x10);
  _Var1 = player_is_resting(player);
  if (_Var1) {
    iVar2 = player_resting_count(player);
    iVar3 = (int)iVar2;
    my_strcpy((char *)&n,"Rest      ",0x10);
    if (iVar3 < 1000) {
      if (iVar3 < 100) {
        if (iVar3 < 10) {
          if (iVar3 < 1) {
            if (iVar3 == -1) {
              text[1] = '*';
              text[0] = '*';
              i._3_1_ = '*';
              i._2_1_ = '*';
              i._1_1_ = '*';
            }
            else if (iVar3 == -2) {
              text[1] = '&';
              text[0] = '&';
              i._3_1_ = '&';
              i._2_1_ = '&';
              i._1_1_ = '&';
            }
            else if (iVar3 == -3) {
              text[1] = '!';
              text[0] = '!';
              i._3_1_ = '!';
              i._2_1_ = '!';
              i._1_1_ = '!';
            }
          }
          else {
            text[1] = (char)iVar2 + '0';
          }
        }
        else {
          text[1] = (char)(iVar3 % 10) + '0';
          text[0] = (char)(iVar3 / 10) + '0';
        }
      }
      else {
        text[1] = (char)(iVar3 % 10) + '0';
        text[0] = (char)((iVar3 / 10) % 10) + '0';
        i._3_1_ = (char)((iVar3 / 10) / 10) + '0';
      }
    }
    else {
      iVar3 = iVar3 / 100;
      text[1] = '0';
      text[0] = '0';
      i._3_1_ = (char)(iVar3 % 10) + '0';
      if (9 < iVar3) {
        iVar3 = iVar3 / 10;
        i._2_1_ = (char)(iVar3 % 10) + '0';
        if (9 < iVar3) {
          i._1_1_ = (char)(iVar3 / 10) + '0';
        }
      }
    }
  }
  else {
    wVar4 = cmd_get_nrepeats();
    if (wVar4 != L'\0') {
      wVar4 = cmd_get_nrepeats();
      if (wVar4 < L'Ϩ') {
        strnfmt((char *)&n,0x10,"Repeat %3d",(ulong)(uint)wVar4);
      }
      else {
        strnfmt((char *)&n,0x10,"Rep. %3d00",(long)wVar4 / 100 & 0xffffffff);
      }
    }
  }
  c_put_str(text[0xf],(char *)&n,row,col);
  sVar5 = strlen((char *)&n);
  return sVar5 + 1;
}

Assistant:

static size_t prt_state(int row, int col)
{
	uint8_t attr = COLOUR_WHITE;

	char text[16] = "";


	/* Displayed states are resting and repeating */
	if (player_is_resting(player)) {
		int i;
		int n = player_resting_count(player);

		/* Start with "Rest" */
		my_strcpy(text, "Rest      ", sizeof(text));

		/* Display according to length or intent of rest */
		if (n >= 1000) {
			i = n / 100;
			text[9] = '0';
			text[8] = '0';
			text[7] = I2D(i % 10);
			if (i >= 10) {
				i = i / 10;
				text[6] = I2D(i % 10);
				if (i >= 10)
					text[5] = I2D(i / 10);
			}
		} else if (n >= 100) {
			i = n;
			text[9] = I2D(i % 10);
			i = i / 10;
			text[8] = I2D(i % 10);
			text[7] = I2D(i / 10);
		} else if (n >= 10) {
			i = n;
			text[9] = I2D(i % 10);
			text[8] = I2D(i / 10);
		} else if (n > 0) {
			i = n;
			text[9] = I2D(i);
		} else if (n == REST_ALL_POINTS)
			text[5] = text[6] = text[7] = text[8] = text[9] = '*';
		else if (n == REST_COMPLETE)
			text[5] = text[6] = text[7] = text[8] = text[9] = '&';
		else if (n == REST_SOME_POINTS)
			text[5] = text[6] = text[7] = text[8] = text[9] = '!';

	} else if (cmd_get_nrepeats()) {
		int nrepeats = cmd_get_nrepeats();

		if (nrepeats > 999)
			strnfmt(text, sizeof(text), "Rep. %3d00", nrepeats / 100);
		else
			strnfmt(text, sizeof(text), "Repeat %3d", nrepeats);
	}

	/* Display the info (or blanks) */
	c_put_str(attr, text, row, col);

	return strlen(text) + 1;
}